

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_test.cpp
# Opt level: O1

void __thiscall unit_test::main(unit_test *this,string *param_1)

{
  char cVar1;
  bool bVar2;
  ostream oVar3;
  int iVar4;
  ostream *poVar5;
  runtime_error *prVar6;
  undefined8 uVar7;
  ostream *poVar8;
  _Base_ptr p_Var9;
  long lVar10;
  _Rb_tree_node_base *p_Var11;
  int iVar12;
  string long_msg;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  env;
  char local_1c9;
  string local_1c8;
  undefined7 uStack_1c7;
  undefined1 local_1b8 [16];
  ostringstream local_1a8 [8];
  _Rb_tree_node_base local_1a0 [11];
  
  cppcms::application::response();
  cppcms::http::response::set_plain_text_header();
  iVar4 = cppcms::application::response();
  cppcms::http::response::setbuf(iVar4);
  bVar2 = is_async;
  cVar1 = cppcms::application::is_asynchronous();
  if (bVar2 != (bool)cVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/proto_test.cpp"
               ,0x5d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,0x20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," is_async == is_asynchronous()",0x1e)
    ;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,&local_1c8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cVar1 = cppcms::application::is_asynchronous();
  cppcms::application::response();
  iVar4 = cppcms::http::response::io_mode();
  if (cVar1 == '\0') {
    if (iVar4 != 0) {
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/proto_test.cpp"
                 ,0x5d);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,0x22);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5," response().io_mode() == cppcms::http::response::normal",0x37);
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,&local_1c8);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar7 = cppcms::application::response();
    cppcms::http::response::io_mode(uVar7,1);
  }
  else if (iVar4 != 3) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/proto_test.cpp"
               ,0x5d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,0x26);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5," response().io_mode() == cppcms::http::response::asynchronous",0x3d);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,&local_1c8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (is_nonblocking == true) {
    bVar2 = (bool)cppcms::application::response();
    cppcms::http::response::full_asynchronous_buffering(bVar2);
  }
  cppcms::application::request();
  cppcms::http::request::getenv_abi_cxx11_();
  cppcms::application::response();
  poVar5 = (ostream *)cppcms::http::response::out();
  if (local_1a0[0]._M_left != local_1a0) {
    p_Var9 = local_1a0[0]._M_left;
    do {
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,*(char **)(p_Var9 + 1),(long)p_Var9[1]._M_parent);
      local_1c8 = (string)0x3a;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_1c8,1);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,*(char **)(p_Var9 + 2),(long)p_Var9[2]._M_parent);
      local_1c8 = (string)0xa;
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_1c8,1);
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while (p_Var9 != local_1a0);
  }
  local_1c8 = (string)0xa;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_1c8,1);
  cppcms::application::request();
  cppcms::http::request::getenv_abi_cxx11_((char *)&local_1c8);
  iVar4 = atoi((char *)CONCAT71(uStack_1c7,local_1c8));
  if (0 < iVar4) {
    iVar12 = 1;
    do {
      poVar8 = poVar5 + *(long *)(*(long *)poVar5 + -0x18);
      if (poVar5[*(long *)(*(long *)poVar5 + -0x18) + 0xe1] == (ostream)0x0) {
        oVar3 = (ostream)std::ios::widen((char)poVar8);
        poVar8[0xe0] = oVar3;
        poVar8[0xe1] = (ostream)0x1;
      }
      poVar8[0xe0] = (ostream)0x30;
      *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 5;
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar5,iVar12);
      local_1c9 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,&local_1c9,1);
      bVar2 = iVar12 != iVar4;
      iVar12 = iVar12 + 1;
    } while (bVar2);
  }
  cppcms::application::request();
  lVar10 = cppcms::http::request::post_abi_cxx11_();
  p_Var11 = *(_Rb_tree_node_base **)(lVar10 + 0x18);
  if (p_Var11 != (_Rb_tree_node_base *)(lVar10 + 8)) {
    do {
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,*(char **)(p_Var11 + 1),(long)p_Var11[1]._M_parent);
      local_1c9 = '=';
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,&local_1c9,1);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,*(char **)(p_Var11 + 2),(long)p_Var11[2]._M_parent);
      local_1c9 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,&local_1c9,1);
      p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
    } while (p_Var11 != (_Rb_tree_node_base *)(lVar10 + 8));
  }
  if ((undefined1 *)CONCAT71(uStack_1c7,local_1c8) != local_1b8) {
    operator_delete((undefined1 *)CONCAT71(uStack_1c7,local_1c8));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_1a8);
  return;
}

Assistant:

virtual void main(std::string /*unused*/)
	{
		response().set_plain_text_header();
		response().setbuf(64);
		TEST(is_async == is_asynchronous());
		if(!is_asynchronous()) {
			TEST(response().io_mode() == cppcms::http::response::normal);
			response().io_mode(cppcms::http::response::nogzip);
		}
		else {
			TEST(response().io_mode() == cppcms::http::response::asynchronous);
		}
		if(is_nonblocking) {
			response().full_asynchronous_buffering(false);
		}
		std::map<std::string,std::string> env=request().getenv();
		std::ostream &out = response().out();
		for(std::map<std::string,std::string>::const_iterator p=env.begin();p!=env.end();++p) {
			out << p->first <<':'<<p->second << '\n';
		}
		out << '\n';
		std::string long_msg = request().getenv("LONG_MESSAGE");
		int lmsg = atoi(long_msg.c_str());
		for(int i=1;i<=lmsg;i++) {
			out << std::setfill('0') << std::setw(5) << i << '\n';
		}
		typedef cppcms::http::request::form_type form_type;
		form_type const &form=request().post();
		for(form_type::const_iterator p=form.begin();p!=form.end();++p) {
			out << p->first <<'='<<p->second << '\n';
		}
	}